

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

bool __thiscall cmCacheManager::CacheIterator::GetPropertyAsBool(CacheIterator *this,string *prop)

{
  _Base_ptr p_Var1;
  bool bVar2;
  char *val;
  
  p_Var1 = (this->Position)._M_node;
  if ((_Rb_tree_header *)p_Var1 != &(this->Container->Cache)._M_t._M_impl.super__Rb_tree_header) {
    val = CacheEntry::GetProperty((CacheEntry *)(p_Var1 + 2),prop);
    if (val != (char *)0x0) {
      bVar2 = cmSystemTools::IsOn(val);
      return bVar2;
    }
  }
  return false;
}

Assistant:

bool cmCacheManager::CacheIterator::IsAtEnd() const
{
  return this->Position == this->Container.Cache.end();
}